

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O2

void Assimp::MD5::MD5Parser::ReportError(char *error,uint line)

{
  DeadlyImportError *this;
  allocator local_439;
  string local_438;
  char szBuffer [1024];
  
  snprintf(szBuffer,0x400,"[MD5] Line %u: %s",line,error);
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_438,szBuffer,&local_439);
  DeadlyImportError::DeadlyImportError(this,&local_438);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void MD5Parser::ReportError (const char* error, unsigned int line)
{
    char szBuffer[1024];
    ::ai_snprintf(szBuffer, 1024, "[MD5] Line %u: %s",line,error);
    throw DeadlyImportError(szBuffer);
}